

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getint(Table *t,lua_Integer key)

{
  int *piVar1;
  Node *pNVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)t->alimit;
  uVar4 = key - 1;
  if (uVar3 <= uVar4) {
    if ((-1 < (char)t->flags) || (uVar3 <= (-uVar3 & uVar4))) {
      if ((ulong)key < 0x80000000) {
        uVar4 = (key & 0xffffffffU) % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
      }
      else {
        uVar4 = (ulong)key % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
      }
      pNVar2 = t->node + uVar4;
      while (((pNVar2->u).key_tt != '\x03' || ((pNVar2->u).key_val.gc != (GCObject *)key))) {
        piVar1 = &(pNVar2->u).next;
        pNVar2 = pNVar2 + *piVar1;
        if ((long)*piVar1 == 0) {
          return &absentkey;
        }
      }
      return (TValue *)pNVar2;
    }
    t->alimit = (uint)key;
  }
  return t->array + uVar4;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  lua_Unsigned alimit = t->alimit;
  if (l_castS2U(key) - 1u < alimit)  /* 'key' in [1, t->alimit]? */
    return &t->array[key - 1];
  else if (!isrealasize(t) &&  /* key still may be in the array part? */
           (((l_castS2U(key) - 1u) & ~(alimit - 1u)) < alimit)) {
    t->alimit = cast_uint(key);  /* probably '#t' is here now */
    return &t->array[key - 1];
  }
  else {  /* key is not in the array part; check the hash */
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (keyisinteger(n) && keyival(n) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return &absentkey;
  }
}